

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

string * vkt::pipeline::anon_unknown_0::getColorStr<float>
                   (string *__return_storage_ptr__,float *data,int numComponents,bool isUint,
                   bool isSint)

{
  char *pcVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  int i;
  char *pcVar4;
  undefined3 in_register_00000081;
  ulong uVar5;
  ostringstream str;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = "i";
  if (CONCAT31(in_register_00000081,isSint) == 0) {
    pcVar1 = "";
  }
  pcVar4 = "u";
  if ((int)CONCAT71(in_register_00000009,isUint) == 0) {
    pcVar4 = pcVar1;
  }
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar4);
  std::operator<<(poVar2,"vec4(");
  uVar5 = 0;
  uVar3 = 0;
  if (0 < numComponents) {
    uVar3 = (ulong)(uint)numComponents;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,data[uVar5]);
    pcVar1 = "";
    if (uVar5 < 3) {
      pcVar1 = ", ";
    }
    std::operator<<(poVar2,pcVar1);
  }
  for (; numComponents < 4; numComponents = numComponents + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,(uint)(numComponents == 3));
    pcVar1 = ", ";
    if (numComponents == 3) {
      pcVar1 = "";
    }
    std::operator<<(poVar2,pcVar1);
  }
  std::operator<<((ostream *)local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string getColorStr (const T* data, int numComponents, const bool isUint, const bool isSint)
{
	const int maxIndex = 3;  // 4 components max

	std::ostringstream str;
	str << (isUint ? "u" : isSint ? "i" : "") << "vec4(";

	for (int i = 0; i < numComponents; ++i)
	{
		str << data[i]
			<< (i < maxIndex ? ", " : "");
	}

	for (int i = numComponents; i < maxIndex + 1; ++i)
	{
		str << (i == maxIndex ? 1 : 0)
			<< (i <  maxIndex ? ", " : "");
	}

	str << ")";
	return str.str();
}